

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O0

void __thiscall
testing::TestPartResult::TestPartResult
          (TestPartResult *this,Type a_type,char *a_file_name,int a_line_number,char *a_message)

{
  undefined4 in_ECX;
  char *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  char *in_R8;
  char *local_58;
  allocator local_3d [5];
  char *in_stack_ffffffffffffffc8;
  allocator local_29;
  char *local_28;
  undefined4 local_1c;
  
  *in_RDI = in_ESI;
  local_58 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_58 = "";
  }
  local_28 = in_R8;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 2),local_58,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  in_RDI[10] = local_1c;
  ExtractSummary_abi_cxx11_(in_stack_ffffffffffffffc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x14),local_28,local_3d);
  std::allocator<char>::~allocator((allocator<char> *)local_3d);
  return;
}

Assistant:

TestPartResult(Type a_type, const char* a_file_name, int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name == nullptr ? "" : a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {}